

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles3::Functional::DepthStencilCaseUtil::generateBaseClearAndDepthCommands
               (TestRenderTarget *target,
               vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
               *clearCommands,
               vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *renderCommands)

{
  deUint32 dVar1;
  int ndx;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  long lVar5;
  NotSupportedError *this;
  uint uVar6;
  uint uVar7;
  int x1;
  FaceType FVar9;
  Vector<float,_4> local_138;
  long local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
  *local_100;
  undefined1 local_f8 [20];
  Vector<float,_4> local_e4;
  deUint32 local_d4;
  bool local_b8;
  deUint32 local_b4;
  float local_b0;
  bool local_ac;
  FaceType local_a8;
  uint local_a4;
  deUint32 local_a0;
  int local_9c;
  BVec4 local_88;
  float depthValues [3];
  int stencilValues [16];
  ulong uVar8;
  
  local_f8._8_4_ = target->width;
  local_f8._12_4_ = target->height;
  iVar2 = (int)local_f8._8_4_ / 4;
  iVar3 = (int)local_f8._12_4_ / 4;
  dVar4 = (int)local_f8._8_4_ / 0xc;
  local_100 = renderCommands;
  if ((0xb < (int)local_f8._8_4_) && (3 < (int)local_f8._12_4_)) {
    local_f8._0_8_ = (pointer)0x0;
    local_138.m_data[0] = 0.0;
    local_138.m_data[1] = 0.0;
    local_138.m_data[2] = 0.0;
    local_138.m_data[3] = 1.0;
    local_f8._16_4_ = 0x4000;
    tcu::Vector<float,_4>::Vector(&local_e4,&local_138);
    local_d4 = 0;
    std::
    vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
    ::emplace_back<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>
              (clearCommands,(ClearCommand *)local_f8);
    getStencilTestValues(target->stencilBits,0x10,stencilValues);
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      depthValues[lVar5] = (float)(int)lVar5 + -1.0;
    }
    for (local_120 = 0; local_120 != 4; local_120 = local_120 + 1) {
      local_118 = local_120 * 4;
      uVar6 = iVar3 * (int)local_120;
      uVar7 = 0;
      for (local_110 = 0; uVar8 = (ulong)uVar7, local_110 != 4; local_110 = local_110 + 1) {
        dVar1 = stencilValues[local_110 | local_118];
        local_108 = uVar8;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          tcu::Vector<float,_4>::Vector(&local_138,0.0);
          FVar9 = (FaceType)uVar8;
          local_f8._16_4_ = 0x400;
          local_f8._8_4_ = dVar4;
          local_f8._12_4_ = iVar3;
          local_f8._0_4_ = FVar9;
          local_f8._4_4_ = uVar6;
          tcu::Vector<float,_4>::Vector(&local_e4,&local_138);
          local_d4 = dVar1;
          std::
          vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
          ::emplace_back<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>
                    (clearCommands,(ClearCommand *)local_f8);
          RenderCommand::RenderCommand((RenderCommand *)local_f8);
          local_f8._0_8_ = (ulong)(uint)local_f8._4_4_ << 0x20;
          local_b0 = depthValues[lVar5];
          local_b8 = true;
          local_b4 = 0x207;
          local_ac = true;
          tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&local_138,false);
          local_88.m_data = (bool  [4])local_138.m_data[0];
          local_a8 = FVar9;
          local_a4 = uVar6;
          local_a0 = dVar4;
          local_9c = iVar3;
          std::
          vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
          ::push_back(local_100,(RenderCommand *)local_f8);
          uVar8 = (ulong)(FVar9 + dVar4);
        }
        uVar7 = (int)local_108 + iVar2;
      }
    }
    return;
  }
  this = (NotSupportedError *)
         __cxa_allocate_exception(0x38,0xc,(long)(int)local_f8._8_4_ % 0xc & 0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"Too small render target",(allocator<char> *)&local_138);
  tcu::NotSupportedError::NotSupportedError(this,(string *)local_f8);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void generateBaseClearAndDepthCommands (const TestRenderTarget& target, vector<ClearCommand>& clearCommands, vector<RenderCommand>& renderCommands)
{
	DE_ASSERT(clearCommands.empty());
	DE_ASSERT(renderCommands.empty());

	const int		numL0CellsX		= 4;
	const int		numL0CellsY		= 4;
	const int		numL1CellsX		= 3;
	const int		numL1CellsY		= 1;
	int				cellL0Width		= target.width/numL0CellsX;
	int				cellL0Height	= target.height/numL0CellsY;
	int				cellL1Width		= cellL0Width/numL1CellsX;
	int				cellL1Height	= cellL0Height/numL1CellsY;

	int				stencilValues[numL0CellsX*numL0CellsY];
	float			depthValues[numL1CellsX*numL1CellsY];

	if (cellL0Width <= 0 || cellL1Width <= 0 || cellL0Height <= 0 || cellL1Height <= 0)
		throw tcu::NotSupportedError("Too small render target");

	// Fullscreen clear to black.
	clearCommands.push_back(ClearCommand(rr::WindowRectangle(0, 0, target.width, target.height), GL_COLOR_BUFFER_BIT, Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0));

	// Compute stencil values: numL0CellsX*numL0CellsY combinations of lowest and highest bits.
	getStencilTestValues(target.stencilBits, numL0CellsX*numL0CellsY, &stencilValues[0]);

	// Compute depth values
	{
		int		numValues		= DE_LENGTH_OF_ARRAY(depthValues);
		float	depthStep		= 2.0f/(float)(numValues-1);

		for (int ndx = 0; ndx < numValues; ndx++)
			depthValues[ndx] = -1.0f + depthStep*(float)ndx;
	}

	for (int y0 = 0; y0 < numL0CellsY; y0++)
	{
		for (int x0 = 0; x0 < numL0CellsX; x0++)
		{
			int stencilValue = stencilValues[y0*numL0CellsX + x0];

			for (int y1 = 0; y1 < numL1CellsY; y1++)
			{
				for (int x1 = 0; x1 < numL1CellsX; x1++)
				{
					int					x			= x0*cellL0Width + x1*cellL1Width;
					int					y			= y0*cellL0Height + y1*cellL1Height;
					rr::WindowRectangle	cellL1Rect	(x, y, cellL1Width, cellL1Height);

					clearCommands.push_back(ClearCommand(cellL1Rect, GL_STENCIL_BUFFER_BIT, Vec4(0), stencilValue));

					RenderCommand renderCmd;
					renderCmd.params.visibleFace		= rr::FACETYPE_FRONT;
					renderCmd.params.depth				= depthValues[y1*numL1CellsX + x1];;
					renderCmd.params.depthTestEnabled	= true;
					renderCmd.params.depthFunc			= GL_ALWAYS;
					renderCmd.params.depthWriteMask		= true;
					renderCmd.colorMask					= tcu::BVec4(false);
					renderCmd.rect						= cellL1Rect;

					renderCommands.push_back(renderCmd);
				}
			}
		}
	}
}